

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_common.cpp
# Opt level: O0

int myutils::SharedSemaphore::open(char *__file,int __oflag,...)

{
  sem_t *psVar1;
  SharedSemaphore *sem;
  char *name_local;
  
  name_local = (char *)operator_new(0x28);
  SharedSemaphore((SharedSemaphore *)name_local);
  psVar1 = sem_open(__file,0);
  ((SharedSemaphore *)name_local)->m_sem = (sem_t *)psVar1;
  if (((SharedSemaphore *)name_local)->m_sem == (sem_t *)0x0) {
    if ((SharedSemaphore *)name_local != (SharedSemaphore *)0x0) {
      ~SharedSemaphore((SharedSemaphore *)name_local);
      operator_delete(name_local);
    }
    name_local = (char *)0x0;
  }
  return (int)name_local;
}

Assistant:

SharedSemaphore* SharedSemaphore::open(const char* name)
{
#ifdef _WIN32    
    HANDLE h = OpenSemaphoreA(SEMAPHORE_ALL_ACCESS, FALSE, name);
    if (h != nullptr) {
        auto sem = new SharedSemaphore();
        sem->m_hSemaphore = h;
        return sem;
    } else {
        return nullptr;
    }
#elif defined(__linux__)
    auto sem = new SharedSemaphore();
    sem->m_sem = sem_open(name, 0);
    if (sem->m_sem != SEM_FAILED) {
        return sem;
    } else {
        delete sem;
        return nullptr;
    }
#else
    auto sem = new SharedSemaphore();
    sem->m_data = (PthreadData*)name;
    return sem;
#endif
}